

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_16781328,_true,_embree::avx2::VirtualCurveIntersectorK<8>,_true>::
     occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  byte bVar1;
  BVH *bvh;
  size_t sVar2;
  ulong uVar3;
  void *pvVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  char cVar28;
  bool bVar29;
  int iVar30;
  AABBNodeMB4D *node1;
  uint uVar31;
  uint uVar32;
  undefined4 uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong extraout_RDX;
  ulong *puVar36;
  long lVar37;
  ulong uVar38;
  NodeRef root;
  undefined1 (*pauVar39) [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar45 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 in_ZMM5 [64];
  float fVar74;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar85 [32];
  undefined1 auVar84 [32];
  undefined1 auVar86 [64];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  vfloat4 a0;
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 in_ZMM12 [64];
  float fVar102;
  float fVar103;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  undefined1 auVar101 [32];
  float fVar112;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [64];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [64];
  vbool<8> terminated;
  TravRayK<8,_true> tray;
  Precalculations pre;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  undefined8 local_5ce0;
  undefined8 uStack_5cd8;
  undefined8 uStack_5cd0;
  undefined8 uStack_5cc8;
  undefined1 local_5c60 [32];
  undefined4 local_5c40 [8];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5c20;
  undefined1 local_5bc0 [32];
  undefined1 local_5ba0 [32];
  undefined1 local_5b80 [8];
  float fStack_5b78;
  float fStack_5b74;
  float fStack_5b70;
  float fStack_5b6c;
  float fStack_5b68;
  undefined4 uStack_5b64;
  undefined1 local_5b60 [32];
  undefined1 local_5b40 [8];
  float fStack_5b38;
  float fStack_5b34;
  float fStack_5b30;
  float fStack_5b2c;
  float fStack_5b28;
  undefined1 local_5b20 [32];
  undefined1 local_5b00 [32];
  undefined1 local_5ae0 [32];
  undefined1 local_5ac0 [32];
  undefined1 local_5aa0 [32];
  undefined1 local_5a80 [32];
  undefined1 local_5a60 [32];
  undefined4 local_5a40;
  undefined4 uStack_5a3c;
  undefined4 uStack_5a38;
  undefined4 uStack_5a34;
  undefined4 uStack_5a30;
  undefined4 uStack_5a2c;
  undefined4 uStack_5a28;
  undefined4 uStack_5a24;
  undefined1 local_5a20 [32];
  undefined1 local_5a00 [32];
  undefined1 local_59e0 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_59c0;
  undefined1 local_59a0 [16];
  undefined1 auStack_5990 [16];
  undefined1 auStack_5980 [368];
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  
  bvh = (BVH *)This->ptr;
  sVar2 = (bvh->root).ptr;
  if (sVar2 != 8) {
    auVar50 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    auVar54 = *(undefined1 (*) [32])(ray + 0x100);
    auVar75 = vpcmpeqd_avx2(auVar50,(undefined1  [32])valid_i->field_0);
    auVar50 = vcmpps_avx(auVar54,ZEXT1632(ZEXT816(0) << 0x40),5);
    auVar50 = vandps_avx(auVar50,auVar75);
    uVar32 = vmovmskps_avx(auVar50);
    if (uVar32 != 0) {
      auVar40 = vpackssdw_avx(auVar50._0_16_,auVar50._16_16_);
      local_5bc0 = *(undefined1 (*) [32])(ray + 0x80);
      local_5ba0 = *(undefined1 (*) [32])(ray + 0xa0);
      _local_5b80 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar86._0_4_ = local_5b80._0_4_ * local_5b80._0_4_;
      auVar86._4_4_ = local_5b80._4_4_ * local_5b80._4_4_;
      auVar86._8_4_ = local_5b80._8_4_ * local_5b80._8_4_;
      auVar86._12_4_ = local_5b80._12_4_ * local_5b80._12_4_;
      auVar86._16_4_ = local_5b80._16_4_ * local_5b80._16_4_;
      auVar86._20_4_ = local_5b80._20_4_ * local_5b80._20_4_;
      auVar86._28_36_ = in_ZMM5._28_36_;
      auVar86._24_4_ = local_5b80._24_4_ * local_5b80._24_4_;
      auVar45 = vfmadd231ps_fma(auVar86._0_32_,local_5ba0,local_5ba0);
      auVar45 = vfmadd231ps_fma(ZEXT1632(auVar45),local_5bc0,local_5bc0);
      auVar50 = vrsqrtps_avx(ZEXT1632(auVar45));
      uVar34 = (ulong)(uVar32 & 0xff);
      fVar74 = auVar50._0_4_;
      fVar78 = auVar50._4_4_;
      fVar79 = auVar50._8_4_;
      fVar80 = auVar50._12_4_;
      fVar81 = auVar50._16_4_;
      fVar82 = auVar50._20_4_;
      fVar83 = auVar50._24_4_;
      auVar75._4_4_ = fVar78 * fVar78 * fVar78 * auVar45._4_4_ * -0.5;
      auVar75._0_4_ = fVar74 * fVar74 * fVar74 * auVar45._0_4_ * -0.5;
      auVar75._8_4_ = fVar79 * fVar79 * fVar79 * auVar45._8_4_ * -0.5;
      auVar75._12_4_ = fVar80 * fVar80 * fVar80 * auVar45._12_4_ * -0.5;
      auVar75._16_4_ = fVar81 * fVar81 * fVar81 * -0.0;
      auVar75._20_4_ = fVar82 * fVar82 * fVar82 * -0.0;
      auVar75._24_4_ = fVar83 * fVar83 * fVar83 * -0.0;
      auVar75._28_4_ = 0;
      auVar44._8_4_ = 0x3fc00000;
      auVar44._0_8_ = 0x3fc000003fc00000;
      auVar44._12_4_ = 0x3fc00000;
      auVar44._16_4_ = 0x3fc00000;
      auVar44._20_4_ = 0x3fc00000;
      auVar44._24_4_ = 0x3fc00000;
      auVar44._28_4_ = 0x3fc00000;
      auVar45 = vfmadd213ps_fma(auVar44,auVar50,auVar75);
      local_59c0 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)ZEXT1632(auVar45);
      auVar68._8_4_ = 0x80000000;
      auVar68._0_8_ = 0x8000000080000000;
      auVar68._12_4_ = 0x80000000;
      auVar45._12_4_ = 0;
      auVar45._0_12_ = ZEXT812(0);
      auVar45 = auVar45 << 0x20;
      while (uVar34 != 0) {
        lVar37 = 0;
        for (uVar35 = uVar34; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
          lVar37 = lVar37 + 1;
        }
        uVar35 = (ulong)(uint)((int)lVar37 * 4);
        auVar89 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar35 + 0x80)),
                                ZEXT416(*(uint *)(ray + uVar35 + 0xa0)),0x1c);
        auVar89 = vinsertps_avx(auVar89,ZEXT416(*(uint *)(ray + uVar35 + 0xc0)),0x28);
        fVar74 = *(float *)((long)&local_59c0 + uVar35);
        auVar92._0_4_ = auVar89._0_4_ * fVar74;
        auVar92._4_4_ = auVar89._4_4_ * fVar74;
        auVar92._8_4_ = auVar89._8_4_ * fVar74;
        auVar92._12_4_ = auVar89._12_4_ * fVar74;
        auVar97 = vshufpd_avx(auVar92,auVar92,1);
        auVar89 = vmovshdup_avx(auVar92);
        auVar94 = vunpckhps_avx(auVar92,auVar45);
        auVar95 = vshufps_avx(auVar94,ZEXT416(auVar89._0_4_ ^ 0x80000000),0x41);
        auVar94._0_8_ = auVar97._0_8_ ^ 0x8000000080000000;
        auVar94._8_8_ = auVar97._8_8_ ^ auVar68._8_8_;
        auVar94 = vinsertps_avx(auVar94,auVar92,0x2a);
        auVar89 = vdpps_avx(auVar95,auVar95,0x7f);
        auVar97 = vdpps_avx(auVar94,auVar94,0x7f);
        auVar89 = vcmpps_avx(auVar97,auVar89,1);
        auVar99._0_4_ = auVar89._0_4_;
        auVar99._4_4_ = auVar99._0_4_;
        auVar99._8_4_ = auVar99._0_4_;
        auVar99._12_4_ = auVar99._0_4_;
        auVar89 = vblendvps_avx(auVar94,auVar95,auVar99);
        auVar97 = vdpps_avx(auVar89,auVar89,0x7f);
        auVar94 = vrsqrtss_avx(auVar97,auVar97);
        fVar78 = auVar94._0_4_;
        fVar78 = fVar78 * 1.5 - auVar97._0_4_ * 0.5 * fVar78 * fVar78 * fVar78;
        auVar95._0_4_ = auVar89._0_4_ * fVar78;
        auVar95._4_4_ = auVar89._4_4_ * fVar78;
        auVar95._8_4_ = auVar89._8_4_ * fVar78;
        auVar95._12_4_ = auVar89._12_4_ * fVar78;
        auVar89 = vshufps_avx(auVar95,auVar95,0xc9);
        auVar97 = vshufps_avx(auVar92,auVar92,0xc9);
        auVar100._0_4_ = auVar95._0_4_ * auVar97._0_4_;
        auVar100._4_4_ = auVar95._4_4_ * auVar97._4_4_;
        auVar100._8_4_ = auVar95._8_4_ * auVar97._8_4_;
        auVar100._12_4_ = auVar95._12_4_ * auVar97._12_4_;
        auVar89 = vfmsub231ps_fma(auVar100,auVar92,auVar89);
        auVar94 = vshufps_avx(auVar89,auVar89,0xc9);
        auVar89 = vdpps_avx(auVar94,auVar94,0x7f);
        uVar34 = uVar34 - 1 & uVar34;
        auVar97 = vrsqrtss_avx(auVar89,auVar89);
        fVar78 = auVar97._0_4_;
        fVar78 = fVar78 * 1.5 - auVar89._0_4_ * 0.5 * fVar78 * fVar78 * fVar78;
        auVar97._0_4_ = fVar78 * auVar94._0_4_;
        auVar97._4_4_ = fVar78 * auVar94._4_4_;
        auVar97._8_4_ = fVar78 * auVar94._8_4_;
        auVar97._12_4_ = fVar78 * auVar94._12_4_;
        auVar89._0_4_ = fVar74 * auVar92._0_4_;
        auVar89._4_4_ = fVar74 * auVar92._4_4_;
        auVar89._8_4_ = fVar74 * auVar92._8_4_;
        auVar89._12_4_ = fVar74 * auVar92._12_4_;
        auVar94 = vunpcklps_avx(auVar95,auVar89);
        auVar89 = vunpckhps_avx(auVar95,auVar89);
        auVar95 = vunpcklps_avx(auVar97,auVar45);
        auVar97 = vunpckhps_avx(auVar97,auVar45);
        auVar97 = vunpcklps_avx(auVar89,auVar97);
        auVar92 = vunpcklps_avx(auVar94,auVar95);
        in_ZMM12 = ZEXT1664(auVar92);
        auVar89 = vunpckhps_avx(auVar94,auVar95);
        lVar37 = lVar37 * 0x30;
        *(undefined1 (*) [16])(local_59a0 + lVar37) = auVar92;
        *(undefined1 (*) [16])(auStack_5990 + lVar37) = auVar89;
        *(undefined1 (*) [16])(auStack_5980 + lVar37) = auVar97;
      }
      local_5c20._0_8_ = *(undefined8 *)ray;
      local_5c20._8_8_ = *(undefined8 *)(ray + 8);
      local_5c20._16_8_ = *(undefined8 *)(ray + 0x10);
      local_5c20._24_8_ = *(undefined8 *)(ray + 0x18);
      local_5c20._32_8_ = *(undefined8 *)(ray + 0x20);
      local_5c20._40_8_ = *(undefined8 *)(ray + 0x28);
      local_5c20._48_8_ = *(undefined8 *)(ray + 0x30);
      local_5c20._56_8_ = *(undefined8 *)(ray + 0x38);
      local_5c20._64_8_ = *(undefined8 *)(ray + 0x40);
      local_5c20._72_8_ = *(undefined8 *)(ray + 0x48);
      local_5c20._80_8_ = *(undefined8 *)(ray + 0x50);
      local_5c20._88_8_ = *(undefined8 *)(ray + 0x58);
      local_5a20._8_4_ = 0x7fffffff;
      local_5a20._0_8_ = 0x7fffffff7fffffff;
      local_5a20._12_4_ = 0x7fffffff;
      local_5a20._16_4_ = 0x7fffffff;
      local_5a20._20_4_ = 0x7fffffff;
      local_5a20._24_4_ = 0x7fffffff;
      local_5a20._28_4_ = 0x7fffffff;
      auVar90._8_4_ = 0x219392ef;
      auVar90._0_8_ = 0x219392ef219392ef;
      auVar90._12_4_ = 0x219392ef;
      auVar90._16_4_ = 0x219392ef;
      auVar90._20_4_ = 0x219392ef;
      auVar90._24_4_ = 0x219392ef;
      auVar90._28_4_ = 0x219392ef;
      auVar84._8_4_ = 0x3f800000;
      auVar84._0_8_ = 0x3f8000003f800000;
      auVar84._12_4_ = 0x3f800000;
      auVar84._16_4_ = 0x3f800000;
      auVar84._20_4_ = 0x3f800000;
      auVar84._24_4_ = 0x3f800000;
      auVar84._28_4_ = 0x3f800000;
      auVar50 = vandps_avx(local_5a20,local_5bc0);
      auVar56 = vdivps_avx(auVar84,local_5bc0);
      auVar75 = vcmpps_avx(auVar50,auVar90,1);
      auVar64 = vdivps_avx(auVar84,local_5ba0);
      auVar50 = vandps_avx(local_5a20,local_5ba0);
      auVar47 = vdivps_avx(auVar84,_local_5b80);
      auVar44 = vcmpps_avx(auVar50,auVar90,1);
      auVar50 = vandps_avx(local_5a20,_local_5b80);
      auVar87._8_4_ = 0x5d5e0b6b;
      auVar87._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar87._12_4_ = 0x5d5e0b6b;
      auVar87._16_4_ = 0x5d5e0b6b;
      auVar87._20_4_ = 0x5d5e0b6b;
      auVar87._24_4_ = 0x5d5e0b6b;
      auVar87._28_4_ = 0x5d5e0b6b;
      local_5b60 = vblendvps_avx(auVar56,auVar87,auVar75);
      _local_5b40 = vblendvps_avx(auVar64,auVar87,auVar44);
      auVar50 = vcmpps_avx(auVar50,auVar90,1);
      local_5b20 = vblendvps_avx(auVar47,auVar87,auVar50);
      auVar50 = vcmpps_avx(local_5b60,ZEXT832(0) << 0x20,1);
      auVar69._8_4_ = 0x20;
      auVar69._0_8_ = 0x2000000020;
      auVar69._12_4_ = 0x20;
      auVar69._16_4_ = 0x20;
      auVar69._20_4_ = 0x20;
      auVar69._24_4_ = 0x20;
      auVar69._28_4_ = 0x20;
      local_5b00 = vandps_avx(auVar50,auVar69);
      auVar64._8_4_ = 0x40;
      auVar64._0_8_ = 0x4000000040;
      auVar64._12_4_ = 0x40;
      auVar64._16_4_ = 0x40;
      auVar64._20_4_ = 0x40;
      auVar64._24_4_ = 0x40;
      auVar64._28_4_ = 0x40;
      auVar70._8_4_ = 0x60;
      auVar70._0_8_ = 0x6000000060;
      auVar70._12_4_ = 0x60;
      auVar70._16_4_ = 0x60;
      auVar70._20_4_ = 0x60;
      auVar70._24_4_ = 0x60;
      auVar70._28_4_ = 0x60;
      auVar50 = vcmpps_avx(_local_5b40,ZEXT832(0) << 0x20,5);
      local_5ae0 = vblendvps_avx(auVar70,auVar64,auVar50);
      auVar56._8_4_ = 0x80;
      auVar56._0_8_ = 0x8000000080;
      auVar56._12_4_ = 0x80;
      auVar56._16_4_ = 0x80;
      auVar56._20_4_ = 0x80;
      auVar56._24_4_ = 0x80;
      auVar56._28_4_ = 0x80;
      auVar47._8_4_ = 0xa0;
      auVar47._0_8_ = 0xa0000000a0;
      auVar47._12_4_ = 0xa0;
      auVar47._16_4_ = 0xa0;
      auVar47._20_4_ = 0xa0;
      auVar47._24_4_ = 0xa0;
      auVar47._28_4_ = 0xa0;
      auVar75 = ZEXT832(0) << 0x20;
      auVar50 = vcmpps_avx(local_5b20,auVar75,5);
      local_5ac0 = vblendvps_avx(auVar47,auVar56,auVar50);
      auVar50 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar75);
      auVar54 = vmaxps_avx(auVar54,auVar75);
      local_5a60 = vpmovsxwd_avx2(auVar40);
      local_4680._8_4_ = 0x7f800000;
      local_4680._0_8_ = 0x7f8000007f800000;
      local_4680._12_4_ = 0x7f800000;
      local_4680._16_4_ = 0x7f800000;
      local_4680._20_4_ = 0x7f800000;
      local_4680._24_4_ = 0x7f800000;
      local_4680._28_4_ = 0x7f800000;
      auVar86 = ZEXT3264(local_4680);
      local_5aa0 = vblendvps_avx(local_4680,auVar50,local_5a60);
      auVar50._8_4_ = 0xff800000;
      auVar50._0_8_ = 0xff800000ff800000;
      auVar50._12_4_ = 0xff800000;
      auVar50._16_4_ = 0xff800000;
      auVar50._20_4_ = 0xff800000;
      auVar50._24_4_ = 0xff800000;
      auVar50._28_4_ = 0xff800000;
      local_5a80 = vblendvps_avx(auVar50,auVar54,local_5a60);
      auVar45 = vpcmpeqd_avx(local_5a80._0_16_,local_5a80._0_16_);
      local_5c60 = vpmovsxwd_avx2(auVar40 ^ auVar45);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar32 = 7;
      }
      else {
        uVar32 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                       RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
      }
      uVar34 = 0;
      puVar36 = local_5800;
      local_5810 = 0xfffffffffffffff8;
      pauVar39 = (undefined1 (*) [32])local_4640;
      local_5808 = sVar2;
      local_4660 = local_5aa0;
      _local_5a40 = mm_lookupmask_ps._16_8_;
      _uStack_5a38 = mm_lookupmask_ps._24_8_;
      _uStack_5a30 = mm_lookupmask_ps._16_8_;
      _uStack_5a28 = mm_lookupmask_ps._24_8_;
      auVar115 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                    CONCAT424(0x3f7ffffa,
                                              CONCAT420(0x3f7ffffa,
                                                        CONCAT416(0x3f7ffffa,
                                                                  CONCAT412(0x3f7ffffa,
                                                                            CONCAT48(0x3f7ffffa,
                                                                                                                                                                          
                                                  0x3f7ffffa3f7ffffa)))))));
      auVar118 = ZEXT3264(CONCAT428(0x3f800003,
                                    CONCAT424(0x3f800003,
                                              CONCAT420(0x3f800003,
                                                        CONCAT416(0x3f800003,
                                                                  CONCAT412(0x3f800003,
                                                                            CONCAT48(0x3f800003,
                                                                                                                                                                          
                                                  0x3f8000033f800003)))))));
LAB_016b0069:
      do {
        do {
          root.ptr = puVar36[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_016b083c;
          puVar36 = puVar36 + -1;
          pauVar39 = pauVar39 + -1;
          auVar54 = *pauVar39;
          auVar49 = ZEXT3264(auVar54);
          auVar50 = vcmpps_avx(auVar54,local_5a80,1);
        } while ((((((((auVar50 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                      (auVar50 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar50 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    SUB321(auVar50 >> 0x7f,0) == '\0') &&
                   (auVar50 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  SUB321(auVar50 >> 0xbf,0) == '\0') &&
                 (auVar50 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 -1 < auVar50[0x1f]);
        uVar33 = vmovmskps_avx(auVar50);
        uVar34 = CONCAT44((int)(uVar34 >> 0x20),uVar33);
        if (uVar32 < (uint)POPCOUNT(uVar33)) {
LAB_016b00a6:
          do {
            auVar54 = local_5c60;
            uVar35 = 0xffffffffffffffe0;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_016b083c;
              auVar50 = vcmpps_avx(local_5a80,auVar49._0_32_,6);
              if ((((((((auVar50 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar50 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar50 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar50 >> 0x7f,0) != '\0') ||
                    (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar50 >> 0xbf,0) != '\0') ||
                  (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar50[0x1f] < '\0') {
                bVar1 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                pvVar4 = This->leafIntersector;
                local_5c40[0] = local_5a40;
                local_5c40[1] = uStack_5a3c;
                local_5c40[2] = uStack_5a38;
                local_5c40[3] = uStack_5a34;
                local_5c40[4] = uStack_5a30;
                local_5c40[5] = uStack_5a2c;
                local_5c40[6] = uStack_5a28;
                local_5c40[7] = uStack_5a24;
                uVar31 = vmovmskps_avx(local_5c60);
                uVar35 = (ulong)(uVar31 ^ 0xff);
                while (uVar35 != 0) {
                  lVar37 = 0;
                  for (uVar34 = uVar35; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000
                      ) {
                    lVar37 = lVar37 + 1;
                  }
                  uVar35 = uVar35 - 1 & uVar35;
                  in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                  cVar28 = (**(code **)((long)pvVar4 + (ulong)bVar1 * 0x40 + 0x28))
                                     (&local_59c0,ray,lVar37,context,
                                      (byte *)(root.ptr & 0xfffffffffffffff0));
                  auVar118 = ZEXT3264(CONCAT428(0x3f800003,
                                                CONCAT424(0x3f800003,
                                                          CONCAT420(0x3f800003,
                                                                    CONCAT416(0x3f800003,
                                                                              CONCAT412(0x3f800003,
                                                                                        CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
                  auVar115 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                                CONCAT424(0x3f7ffffa,
                                                          CONCAT420(0x3f7ffffa,
                                                                    CONCAT416(0x3f7ffffa,
                                                                              CONCAT412(0x3f7ffffa,
                                                                                        CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
                  auVar86 = ZEXT3264(CONCAT428(0x7f800000,
                                               CONCAT424(0x7f800000,
                                                         CONCAT420(0x7f800000,
                                                                   CONCAT416(0x7f800000,
                                                                             CONCAT412(0x7f800000,
                                                                                       CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                  uVar34 = extraout_RDX;
                  if (cVar28 != '\0') {
                    local_5c40[lVar37] = 0xffffffff;
                  }
                }
                auVar21._8_4_ = local_5c40[2];
                auVar21._12_4_ = local_5c40[3];
                auVar21._0_4_ = local_5c40[0];
                auVar21._4_4_ = local_5c40[1];
                auVar21._16_4_ = local_5c40[4];
                auVar21._20_4_ = local_5c40[5];
                auVar21._24_4_ = local_5c40[6];
                auVar21._28_4_ = local_5c40[7];
                local_5c60 = vorps_avx(auVar54,auVar21);
                auVar54 = _DAT_01f7b020 & ~local_5c60;
                if ((((((((auVar54 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar54 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar54 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar54 >> 0x7f,0) == '\0') &&
                      (auVar54 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar54 >> 0xbf,0) == '\0') &&
                    (auVar54 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar54[0x1f]) goto LAB_016b083c;
                auVar54._8_4_ = 0xff800000;
                auVar54._0_8_ = 0xff800000ff800000;
                auVar54._12_4_ = 0xff800000;
                auVar54._16_4_ = 0xff800000;
                auVar54._20_4_ = 0xff800000;
                auVar54._24_4_ = 0xff800000;
                auVar54._28_4_ = 0xff800000;
                local_5a80 = vblendvps_avx(local_5a80,auVar54,local_5c60);
              }
              goto LAB_016b0069;
            }
            uVar34 = root.ptr & 0xfffffffffffffff0;
            uVar31 = (uint)root.ptr & 7;
            auVar54 = vcmpps_avx(local_5a80,auVar49._0_32_,6);
            auVar50 = auVar86._0_32_;
            root.ptr = 8;
            for (; (auVar49 = ZEXT3264(auVar50), uVar35 != 0 &&
                   (uVar3 = *(ulong *)(uVar34 + 0x40 + uVar35 * 2), uVar3 != 8));
                uVar35 = uVar35 + 4) {
              auVar49._28_36_ = in_ZMM12._28_36_;
              if ((uVar31 == 6) || (uVar31 == 1)) {
                uVar33 = *(undefined4 *)(uVar34 + 0x120 + uVar35);
                auVar41._4_4_ = uVar33;
                auVar41._0_4_ = uVar33;
                auVar41._8_4_ = uVar33;
                auVar41._12_4_ = uVar33;
                auVar41._16_4_ = uVar33;
                auVar41._20_4_ = uVar33;
                auVar41._24_4_ = uVar33;
                auVar41._28_4_ = uVar33;
                uVar33 = *(undefined4 *)(uVar34 + 0x60 + uVar35);
                auVar51._4_4_ = uVar33;
                auVar51._0_4_ = uVar33;
                auVar51._8_4_ = uVar33;
                auVar51._12_4_ = uVar33;
                auVar51._16_4_ = uVar33;
                auVar51._20_4_ = uVar33;
                auVar51._24_4_ = uVar33;
                auVar51._28_4_ = uVar33;
                auVar75 = *(undefined1 (*) [32])(ray + 0xe0);
                uVar33 = *(undefined4 *)(uVar34 + 0x160 + uVar35);
                auVar57._4_4_ = uVar33;
                auVar57._0_4_ = uVar33;
                auVar57._8_4_ = uVar33;
                auVar57._12_4_ = uVar33;
                auVar57._16_4_ = uVar33;
                auVar57._20_4_ = uVar33;
                auVar57._24_4_ = uVar33;
                auVar57._28_4_ = uVar33;
                auVar40 = vfmadd231ps_fma(auVar51,auVar75,auVar41);
                uVar33 = *(undefined4 *)(uVar34 + 0xa0 + uVar35);
                auVar42._4_4_ = uVar33;
                auVar42._0_4_ = uVar33;
                auVar42._8_4_ = uVar33;
                auVar42._12_4_ = uVar33;
                auVar42._16_4_ = uVar33;
                auVar42._20_4_ = uVar33;
                auVar42._24_4_ = uVar33;
                auVar42._28_4_ = uVar33;
                auVar45 = vfmadd231ps_fma(auVar42,auVar75,auVar57);
                uVar33 = *(undefined4 *)(uVar34 + 0x1a0 + uVar35);
                auVar58._4_4_ = uVar33;
                auVar58._0_4_ = uVar33;
                auVar58._8_4_ = uVar33;
                auVar58._12_4_ = uVar33;
                auVar58._16_4_ = uVar33;
                auVar58._20_4_ = uVar33;
                auVar58._24_4_ = uVar33;
                auVar58._28_4_ = uVar33;
                uVar33 = *(undefined4 *)(uVar34 + 0xe0 + uVar35);
                auVar65._4_4_ = uVar33;
                auVar65._0_4_ = uVar33;
                auVar65._8_4_ = uVar33;
                auVar65._12_4_ = uVar33;
                auVar65._16_4_ = uVar33;
                auVar65._20_4_ = uVar33;
                auVar65._24_4_ = uVar33;
                auVar65._28_4_ = uVar33;
                uVar33 = *(undefined4 *)(uVar34 + 0x140 + uVar35);
                auVar71._4_4_ = uVar33;
                auVar71._0_4_ = uVar33;
                auVar71._8_4_ = uVar33;
                auVar71._12_4_ = uVar33;
                auVar71._16_4_ = uVar33;
                auVar71._20_4_ = uVar33;
                auVar71._24_4_ = uVar33;
                auVar71._28_4_ = uVar33;
                uVar33 = *(undefined4 *)(uVar34 + 0x80 + uVar35);
                auVar76._4_4_ = uVar33;
                auVar76._0_4_ = uVar33;
                auVar76._8_4_ = uVar33;
                auVar76._12_4_ = uVar33;
                auVar76._16_4_ = uVar33;
                auVar76._20_4_ = uVar33;
                auVar76._24_4_ = uVar33;
                auVar76._28_4_ = uVar33;
                auVar68 = vfmadd231ps_fma(auVar65,auVar75,auVar58);
                auVar89 = vfmadd231ps_fma(auVar76,auVar75,auVar71);
                uVar33 = *(undefined4 *)(uVar34 + 0x180 + uVar35);
                auVar59._4_4_ = uVar33;
                auVar59._0_4_ = uVar33;
                auVar59._8_4_ = uVar33;
                auVar59._12_4_ = uVar33;
                auVar59._16_4_ = uVar33;
                auVar59._20_4_ = uVar33;
                auVar59._24_4_ = uVar33;
                auVar59._28_4_ = uVar33;
                uVar33 = *(undefined4 *)(uVar34 + 0xc0 + uVar35);
                auVar72._4_4_ = uVar33;
                auVar72._0_4_ = uVar33;
                auVar72._8_4_ = uVar33;
                auVar72._12_4_ = uVar33;
                auVar72._16_4_ = uVar33;
                auVar72._20_4_ = uVar33;
                auVar72._24_4_ = uVar33;
                auVar72._28_4_ = uVar33;
                uVar33 = *(undefined4 *)(uVar34 + 0x1c0 + uVar35);
                auVar88._4_4_ = uVar33;
                auVar88._0_4_ = uVar33;
                auVar88._8_4_ = uVar33;
                auVar88._12_4_ = uVar33;
                auVar88._16_4_ = uVar33;
                auVar88._20_4_ = uVar33;
                auVar88._24_4_ = uVar33;
                auVar88._28_4_ = uVar33;
                auVar97 = vfmadd231ps_fma(auVar72,auVar75,auVar59);
                uVar33 = *(undefined4 *)(uVar34 + 0x100 + uVar35);
                auVar60._4_4_ = uVar33;
                auVar60._0_4_ = uVar33;
                auVar60._8_4_ = uVar33;
                auVar60._12_4_ = uVar33;
                auVar60._16_4_ = uVar33;
                auVar60._20_4_ = uVar33;
                auVar60._24_4_ = uVar33;
                auVar60._28_4_ = uVar33;
                auVar94 = vfmadd231ps_fma(auVar60,auVar75,auVar88);
                auVar22._8_8_ = local_5c20._8_8_;
                auVar22._0_8_ = local_5c20._0_8_;
                auVar22._16_8_ = local_5c20._16_8_;
                auVar22._24_8_ = local_5c20._24_8_;
                auVar24._8_8_ = local_5c20._40_8_;
                auVar24._0_8_ = local_5c20._32_8_;
                auVar24._16_8_ = local_5c20._48_8_;
                auVar24._24_8_ = local_5c20._56_8_;
                auVar26._8_8_ = local_5c20._72_8_;
                auVar26._0_8_ = local_5c20._64_8_;
                auVar26._16_8_ = local_5c20._80_8_;
                auVar26._24_8_ = local_5c20._88_8_;
                auVar44 = vsubps_avx(ZEXT1632(auVar40),auVar22);
                auVar49._0_4_ = local_5b60._0_4_ * auVar44._0_4_;
                auVar49._4_4_ = local_5b60._4_4_ * auVar44._4_4_;
                auVar49._8_4_ = local_5b60._8_4_ * auVar44._8_4_;
                auVar49._12_4_ = local_5b60._12_4_ * auVar44._12_4_;
                auVar49._16_4_ = local_5b60._16_4_ * auVar44._16_4_;
                auVar49._20_4_ = local_5b60._20_4_ * auVar44._20_4_;
                auVar49._24_4_ = local_5b60._24_4_ * auVar44._24_4_;
                auVar64 = auVar49._0_32_;
                in_ZMM12 = ZEXT3264(auVar64);
                auVar44 = vsubps_avx(ZEXT1632(auVar45),auVar24);
                auVar5._4_4_ = auVar44._4_4_ * (float)local_5b40._4_4_;
                auVar5._0_4_ = auVar44._0_4_ * (float)local_5b40._0_4_;
                auVar5._8_4_ = auVar44._8_4_ * fStack_5b38;
                auVar5._12_4_ = auVar44._12_4_ * fStack_5b34;
                auVar5._16_4_ = auVar44._16_4_ * fStack_5b30;
                auVar5._20_4_ = auVar44._20_4_ * fStack_5b2c;
                auVar5._24_4_ = auVar44._24_4_ * fStack_5b28;
                auVar5._28_4_ = auVar44._28_4_;
                auVar44 = vsubps_avx(ZEXT1632(auVar68),auVar26);
                auVar6._4_4_ = local_5b20._4_4_ * auVar44._4_4_;
                auVar6._0_4_ = local_5b20._0_4_ * auVar44._0_4_;
                auVar6._8_4_ = local_5b20._8_4_ * auVar44._8_4_;
                auVar6._12_4_ = local_5b20._12_4_ * auVar44._12_4_;
                auVar6._16_4_ = local_5b20._16_4_ * auVar44._16_4_;
                auVar6._20_4_ = local_5b20._20_4_ * auVar44._20_4_;
                auVar6._24_4_ = local_5b20._24_4_ * auVar44._24_4_;
                auVar6._28_4_ = auVar44._28_4_;
                auVar44 = vsubps_avx(ZEXT1632(auVar89),auVar22);
                auVar7._4_4_ = local_5b60._4_4_ * auVar44._4_4_;
                auVar7._0_4_ = local_5b60._0_4_ * auVar44._0_4_;
                auVar7._8_4_ = local_5b60._8_4_ * auVar44._8_4_;
                auVar7._12_4_ = local_5b60._12_4_ * auVar44._12_4_;
                auVar7._16_4_ = local_5b60._16_4_ * auVar44._16_4_;
                auVar7._20_4_ = local_5b60._20_4_ * auVar44._20_4_;
                auVar7._24_4_ = local_5b60._24_4_ * auVar44._24_4_;
                auVar7._28_4_ = auVar44._28_4_;
                auVar44 = vsubps_avx(ZEXT1632(auVar97),auVar24);
                auVar8._4_4_ = auVar44._4_4_ * (float)local_5b40._4_4_;
                auVar8._0_4_ = auVar44._0_4_ * (float)local_5b40._0_4_;
                auVar8._8_4_ = auVar44._8_4_ * fStack_5b38;
                auVar8._12_4_ = auVar44._12_4_ * fStack_5b34;
                auVar8._16_4_ = auVar44._16_4_ * fStack_5b30;
                auVar8._20_4_ = auVar44._20_4_ * fStack_5b2c;
                auVar8._24_4_ = auVar44._24_4_ * fStack_5b28;
                auVar8._28_4_ = auVar44._28_4_;
                auVar44 = vsubps_avx(ZEXT1632(auVar94),auVar26);
                auVar61._0_4_ = local_5b20._0_4_ * auVar44._0_4_;
                auVar61._4_4_ = local_5b20._4_4_ * auVar44._4_4_;
                auVar61._8_4_ = local_5b20._8_4_ * auVar44._8_4_;
                auVar61._12_4_ = local_5b20._12_4_ * auVar44._12_4_;
                auVar61._16_4_ = local_5b20._16_4_ * auVar44._16_4_;
                auVar61._20_4_ = local_5b20._20_4_ * auVar44._20_4_;
                auVar61._24_4_ = local_5b20._24_4_ * auVar44._24_4_;
                auVar61._28_4_ = 0;
                auVar44 = vpminsd_avx2(auVar64,auVar7);
                auVar56 = vpminsd_avx2(auVar5,auVar8);
                auVar44 = vpmaxsd_avx2(auVar44,auVar56);
                auVar56 = vpminsd_avx2(auVar6,auVar61);
                auVar44 = vpmaxsd_avx2(auVar44,auVar56);
                auVar53._4_4_ = auVar115._4_4_ * auVar44._4_4_;
                auVar53._0_4_ = auVar115._0_4_ * auVar44._0_4_;
                auVar53._8_4_ = auVar115._8_4_ * auVar44._8_4_;
                auVar53._12_4_ = auVar115._12_4_ * auVar44._12_4_;
                auVar53._16_4_ = auVar115._16_4_ * auVar44._16_4_;
                auVar53._20_4_ = auVar115._20_4_ * auVar44._20_4_;
                auVar53._24_4_ = auVar115._24_4_ * auVar44._24_4_;
                auVar53._28_4_ = auVar44._28_4_;
                auVar44 = vpmaxsd_avx2(auVar64,auVar7);
                auVar56 = vpmaxsd_avx2(auVar5,auVar8);
                auVar56 = vpminsd_avx2(auVar44,auVar56);
                auVar44 = vpmaxsd_avx2(auVar6,auVar61);
                auVar44 = vpminsd_avx2(auVar56,auVar44);
                auVar9._4_4_ = auVar118._4_4_ * auVar44._4_4_;
                auVar9._0_4_ = auVar118._0_4_ * auVar44._0_4_;
                auVar9._8_4_ = auVar118._8_4_ * auVar44._8_4_;
                auVar9._12_4_ = auVar118._12_4_ * auVar44._12_4_;
                auVar9._16_4_ = auVar118._16_4_ * auVar44._16_4_;
                auVar9._20_4_ = auVar118._20_4_ * auVar44._20_4_;
                auVar9._24_4_ = auVar118._24_4_ * auVar44._24_4_;
                auVar9._28_4_ = auVar44._28_4_;
                auVar44 = vpmaxsd_avx2(auVar53,local_5aa0);
                auVar56 = vpminsd_avx2(auVar9,local_5a80);
                auVar44 = vcmpps_avx(auVar44,auVar56,2);
                if (uVar31 != 6) goto LAB_016b056b;
                uVar33 = *(undefined4 *)(uVar34 + 0x1e0 + uVar35);
                auVar62._4_4_ = uVar33;
                auVar62._0_4_ = uVar33;
                auVar62._8_4_ = uVar33;
                auVar62._12_4_ = uVar33;
                auVar62._16_4_ = uVar33;
                auVar62._20_4_ = uVar33;
                auVar62._24_4_ = uVar33;
                auVar62._28_4_ = uVar33;
                auVar56 = vcmpps_avx(auVar62,auVar75,2);
                uVar33 = *(undefined4 *)(uVar34 + 0x200 + uVar35);
                auVar66._4_4_ = uVar33;
                auVar66._0_4_ = uVar33;
                auVar66._8_4_ = uVar33;
                auVar66._12_4_ = uVar33;
                auVar66._16_4_ = uVar33;
                auVar66._20_4_ = uVar33;
                auVar66._24_4_ = uVar33;
                auVar66._28_4_ = uVar33;
                auVar75 = vcmpps_avx(auVar75,auVar66,1);
                auVar75 = vandps_avx(auVar56,auVar75);
                auVar75 = vandps_avx(auVar75,auVar44);
                auVar40 = auVar75._0_16_;
                auVar45 = auVar75._16_16_;
              }
              else {
                uVar33 = *(undefined4 *)(uVar34 + 0x60 + uVar35);
                auVar77._4_4_ = uVar33;
                auVar77._0_4_ = uVar33;
                auVar77._8_4_ = uVar33;
                auVar77._12_4_ = uVar33;
                auVar77._16_4_ = uVar33;
                auVar77._20_4_ = uVar33;
                auVar77._24_4_ = uVar33;
                auVar77._28_4_ = uVar33;
                uVar33 = *(undefined4 *)(uVar34 + 0x80 + uVar35);
                local_5a00._4_4_ = uVar33;
                local_5a00._0_4_ = uVar33;
                local_5a00._8_4_ = uVar33;
                local_5a00._12_4_ = uVar33;
                local_5a00._16_4_ = uVar33;
                local_5a00._20_4_ = uVar33;
                local_5a00._24_4_ = uVar33;
                local_5a00._28_4_ = uVar33;
                uVar33 = *(undefined4 *)(uVar34 + 0xa0 + uVar35);
                local_59e0._4_4_ = uVar33;
                local_59e0._0_4_ = uVar33;
                local_59e0._8_4_ = uVar33;
                local_59e0._12_4_ = uVar33;
                local_59e0._16_4_ = uVar33;
                local_59e0._20_4_ = uVar33;
                local_59e0._24_4_ = uVar33;
                local_59e0._28_4_ = uVar33;
                uVar33 = *(undefined4 *)(uVar34 + 0xc0 + uVar35);
                auVar98._4_4_ = uVar33;
                auVar98._0_4_ = uVar33;
                auVar98._8_4_ = uVar33;
                auVar98._12_4_ = uVar33;
                auVar98._16_4_ = uVar33;
                auVar98._20_4_ = uVar33;
                auVar98._24_4_ = uVar33;
                auVar98._28_4_ = uVar33;
                uVar33 = *(undefined4 *)(uVar34 + 0xe0 + uVar35);
                auVar96._4_4_ = uVar33;
                auVar96._0_4_ = uVar33;
                auVar96._8_4_ = uVar33;
                auVar96._12_4_ = uVar33;
                auVar96._16_4_ = uVar33;
                auVar96._20_4_ = uVar33;
                auVar96._24_4_ = uVar33;
                auVar96._28_4_ = uVar33;
                uVar33 = *(undefined4 *)(uVar34 + 0x100 + uVar35);
                auVar93._4_4_ = uVar33;
                auVar93._0_4_ = uVar33;
                auVar93._8_4_ = uVar33;
                auVar93._12_4_ = uVar33;
                auVar93._16_4_ = uVar33;
                auVar93._20_4_ = uVar33;
                auVar93._24_4_ = uVar33;
                auVar93._28_4_ = uVar33;
                fVar74 = *(float *)(uVar34 + 0x120 + uVar35);
                auVar101._4_4_ = fVar74;
                auVar101._0_4_ = fVar74;
                auVar101._8_4_ = fVar74;
                auVar101._12_4_ = fVar74;
                auVar101._16_4_ = fVar74;
                auVar101._20_4_ = fVar74;
                auVar101._24_4_ = fVar74;
                auVar101._28_4_ = fVar74;
                fVar78 = *(float *)(uVar34 + 0x140 + uVar35);
                auVar113._4_4_ = fVar78;
                auVar113._0_4_ = fVar78;
                auVar113._8_4_ = fVar78;
                auVar113._12_4_ = fVar78;
                auVar113._16_4_ = fVar78;
                auVar113._20_4_ = fVar78;
                auVar113._24_4_ = fVar78;
                auVar113._28_4_ = fVar78;
                fVar79 = *(float *)(uVar34 + 0x160 + uVar35);
                auVar116._4_4_ = fVar79;
                auVar116._0_4_ = fVar79;
                auVar116._8_4_ = fVar79;
                auVar116._12_4_ = fVar79;
                auVar116._16_4_ = fVar79;
                auVar116._20_4_ = fVar79;
                auVar116._24_4_ = fVar79;
                auVar116._28_4_ = fVar79;
                uVar33 = *(undefined4 *)(uVar34 + 0x180 + uVar35);
                auVar63._4_4_ = uVar33;
                auVar63._0_4_ = uVar33;
                auVar63._8_4_ = uVar33;
                auVar63._12_4_ = uVar33;
                auVar63._16_4_ = uVar33;
                auVar63._20_4_ = uVar33;
                auVar63._24_4_ = uVar33;
                auVar63._28_4_ = uVar33;
                uVar33 = *(undefined4 *)(uVar34 + 0x1a0 + uVar35);
                auVar91._4_4_ = uVar33;
                auVar91._0_4_ = uVar33;
                auVar91._8_4_ = uVar33;
                auVar91._12_4_ = uVar33;
                auVar91._16_4_ = uVar33;
                auVar91._20_4_ = uVar33;
                auVar91._24_4_ = uVar33;
                auVar91._28_4_ = uVar33;
                uVar33 = *(undefined4 *)(uVar34 + 0x1c0 + uVar35);
                auVar73._4_4_ = uVar33;
                auVar73._0_4_ = uVar33;
                auVar73._8_4_ = uVar33;
                auVar73._12_4_ = uVar33;
                auVar73._16_4_ = uVar33;
                auVar73._20_4_ = uVar33;
                auVar73._24_4_ = uVar33;
                auVar73._28_4_ = uVar33;
                fVar80 = *(float *)(uVar34 + 0x1e0 + uVar35);
                fVar81 = *(float *)(uVar34 + 0x200 + uVar35);
                fVar82 = *(float *)(uVar34 + 0x220 + uVar35);
                auVar27._8_8_ = local_5c20._72_8_;
                auVar27._0_8_ = local_5c20._64_8_;
                auVar27._16_8_ = local_5c20._80_8_;
                auVar27._24_8_ = local_5c20._88_8_;
                auVar40 = vfmadd231ps_fma(auVar63,auVar27,auVar101);
                auVar45 = vfmadd231ps_fma(auVar91,auVar27,auVar113);
                auVar68 = vfmadd231ps_fma(auVar73,auVar27,auVar116);
                auVar10._4_4_ = fVar74 * (float)local_5b80._4_4_;
                auVar10._0_4_ = fVar74 * (float)local_5b80._0_4_;
                auVar10._8_4_ = fVar74 * fStack_5b78;
                auVar10._12_4_ = fVar74 * fStack_5b74;
                auVar10._16_4_ = fVar74 * fStack_5b70;
                auVar10._20_4_ = fVar74 * fStack_5b6c;
                auVar10._24_4_ = fVar74 * fStack_5b68;
                auVar10._28_4_ = fVar74;
                auVar11._4_4_ = fVar78 * (float)local_5b80._4_4_;
                auVar11._0_4_ = fVar78 * (float)local_5b80._0_4_;
                auVar11._8_4_ = fVar78 * fStack_5b78;
                auVar11._12_4_ = fVar78 * fStack_5b74;
                auVar11._16_4_ = fVar78 * fStack_5b70;
                auVar11._20_4_ = fVar78 * fStack_5b6c;
                auVar11._24_4_ = fVar78 * fStack_5b68;
                auVar11._28_4_ = fVar78;
                auVar12._4_4_ = fVar79 * (float)local_5b80._4_4_;
                auVar12._0_4_ = fVar79 * (float)local_5b80._0_4_;
                auVar12._8_4_ = fVar79 * fStack_5b78;
                auVar12._12_4_ = fVar79 * fStack_5b74;
                auVar12._16_4_ = fVar79 * fStack_5b70;
                auVar12._20_4_ = fVar79 * fStack_5b6c;
                auVar12._24_4_ = fVar79 * fStack_5b68;
                auVar12._28_4_ = uStack_5b64;
                auVar89 = vfmadd231ps_fma(auVar10,local_5ba0,auVar98);
                auVar97 = vfmadd231ps_fma(auVar11,local_5ba0,auVar96);
                auVar94 = vfmadd231ps_fma(auVar12,auVar93,local_5ba0);
                fVar74 = *(float *)(uVar34 + 0x240 + uVar35);
                auVar25._8_8_ = local_5c20._40_8_;
                auVar25._0_8_ = local_5c20._32_8_;
                auVar25._16_8_ = local_5c20._48_8_;
                auVar25._24_8_ = local_5c20._56_8_;
                auVar40 = vfmadd231ps_fma(ZEXT1632(auVar40),auVar25,auVar98);
                auVar45 = vfmadd231ps_fma(ZEXT1632(auVar45),auVar25,auVar96);
                fVar78 = *(float *)(uVar34 + 0x260 + uVar35);
                auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),auVar25,auVar93);
                fVar79 = *(float *)(uVar34 + 0x280 + uVar35);
                auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),local_5bc0,auVar77);
                auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),local_5bc0,local_5a00);
                auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),local_59e0,local_5bc0);
                auVar75 = vandps_avx(ZEXT1632(auVar89),local_5a20);
                auVar46._8_4_ = 0x219392ef;
                auVar46._0_8_ = 0x219392ef219392ef;
                auVar46._12_4_ = 0x219392ef;
                auVar46._16_4_ = 0x219392ef;
                auVar46._20_4_ = 0x219392ef;
                auVar46._24_4_ = 0x219392ef;
                auVar46._28_4_ = 0x219392ef;
                auVar75 = vcmpps_avx(auVar75,auVar46,1);
                auVar44 = vblendvps_avx(ZEXT1632(auVar89),auVar46,auVar75);
                auVar75 = vandps_avx(ZEXT1632(auVar97),local_5a20);
                auVar75 = vcmpps_avx(auVar75,auVar46,1);
                auVar56 = vblendvps_avx(ZEXT1632(auVar97),auVar46,auVar75);
                auVar75 = vandps_avx(local_5a20,ZEXT1632(auVar94));
                auVar47 = vcmpps_avx(auVar75,auVar46,1);
                auVar64 = vblendvps_avx(ZEXT1632(auVar94),auVar46,auVar47);
                auVar75 = *(undefined1 (*) [32])(ray + 0xe0);
                fVar83 = auVar75._0_4_;
                auVar114._0_4_ = fVar83 * fVar80;
                fVar102 = auVar75._4_4_;
                auVar114._4_4_ = fVar102 * fVar80;
                fVar103 = auVar75._8_4_;
                auVar114._8_4_ = fVar103 * fVar80;
                fVar104 = auVar75._12_4_;
                auVar114._12_4_ = fVar104 * fVar80;
                fVar106 = auVar75._16_4_;
                auVar114._16_4_ = fVar106 * fVar80;
                fVar108 = auVar75._20_4_;
                auVar114._20_4_ = fVar108 * fVar80;
                fVar110 = auVar75._24_4_;
                auVar114._24_4_ = fVar110 * fVar80;
                auVar114._28_4_ = 0;
                auVar13._4_4_ = fVar81 * fVar102;
                auVar13._0_4_ = fVar81 * fVar83;
                auVar13._8_4_ = fVar81 * fVar103;
                auVar13._12_4_ = fVar81 * fVar104;
                auVar13._16_4_ = fVar81 * fVar106;
                auVar13._20_4_ = fVar81 * fVar108;
                auVar13._24_4_ = fVar81 * fVar110;
                auVar13._28_4_ = auVar47._28_4_;
                auVar14._4_4_ = fVar102 * fVar82;
                auVar14._0_4_ = fVar83 * fVar82;
                auVar14._8_4_ = fVar103 * fVar82;
                auVar14._12_4_ = fVar104 * fVar82;
                auVar14._16_4_ = fVar106 * fVar82;
                auVar14._20_4_ = fVar108 * fVar82;
                auVar14._24_4_ = fVar110 * fVar82;
                auVar14._28_4_ = fVar81;
                auVar52._8_4_ = 0x3f800000;
                auVar52._0_8_ = 0x3f8000003f800000;
                auVar52._12_4_ = 0x3f800000;
                auVar52._16_4_ = 0x3f800000;
                auVar52._20_4_ = 0x3f800000;
                auVar52._24_4_ = 0x3f800000;
                auVar52._28_4_ = 0x3f800000;
                auVar75 = vsubps_avx(auVar52,auVar75);
                auVar47 = ZEXT1232(ZEXT812(0)) << 0x20;
                auVar89 = vfmadd231ps_fma(auVar114,auVar75,auVar47);
                auVar97 = vfmadd231ps_fma(auVar13,auVar75,auVar47);
                in_ZMM12 = ZEXT1664(auVar97);
                auVar94 = vfmadd231ps_fma(auVar14,auVar75,ZEXT1232(ZEXT812(0)) << 0x20);
                fVar80 = auVar75._0_4_;
                auVar117._0_4_ = fVar80 + fVar74 * fVar83;
                fVar81 = auVar75._4_4_;
                auVar117._4_4_ = fVar81 + fVar74 * fVar102;
                fVar82 = auVar75._8_4_;
                auVar117._8_4_ = fVar82 + fVar74 * fVar103;
                fVar105 = auVar75._12_4_;
                auVar117._12_4_ = fVar105 + fVar74 * fVar104;
                fVar107 = auVar75._16_4_;
                auVar117._16_4_ = fVar107 + fVar74 * fVar106;
                fVar109 = auVar75._20_4_;
                auVar117._20_4_ = fVar109 + fVar74 * fVar108;
                fVar111 = auVar75._24_4_;
                auVar117._24_4_ = fVar111 + fVar74 * fVar110;
                fVar112 = auVar75._28_4_;
                auVar117._28_4_ = fVar112 + fVar74;
                auVar67._0_4_ = fVar80 + fVar83 * fVar78;
                auVar67._4_4_ = fVar81 + fVar102 * fVar78;
                auVar67._8_4_ = fVar82 + fVar103 * fVar78;
                auVar67._12_4_ = fVar105 + fVar104 * fVar78;
                auVar67._16_4_ = fVar107 + fVar106 * fVar78;
                auVar67._20_4_ = fVar109 + fVar108 * fVar78;
                auVar67._24_4_ = fVar111 + fVar110 * fVar78;
                auVar67._28_4_ = fVar112 + fVar78;
                auVar85._0_4_ = fVar80 + fVar83 * fVar79;
                auVar85._4_4_ = fVar81 + fVar102 * fVar79;
                auVar85._8_4_ = fVar82 + fVar103 * fVar79;
                auVar85._12_4_ = fVar105 + fVar104 * fVar79;
                auVar85._16_4_ = fVar107 + fVar106 * fVar79;
                auVar85._20_4_ = fVar109 + fVar108 * fVar79;
                auVar85._24_4_ = fVar111 + fVar110 * fVar79;
                auVar85._28_4_ = fVar112 + fVar79;
                auVar23._8_8_ = local_5c20._8_8_;
                auVar23._0_8_ = local_5c20._0_8_;
                auVar23._16_8_ = local_5c20._16_8_;
                auVar23._24_8_ = local_5c20._24_8_;
                auVar95 = vfmadd231ps_fma(ZEXT1632(auVar40),auVar23,auVar77);
                auVar92 = vfmadd231ps_fma(ZEXT1632(auVar45),auVar23,local_5a00);
                auVar99 = vfmadd231ps_fma(ZEXT1632(auVar68),auVar23,local_59e0);
                auVar75 = vrcpps_avx(auVar44);
                auVar40 = vfnmadd213ps_fma(auVar44,auVar75,auVar52);
                auVar44 = vrcpps_avx(auVar56);
                auVar40 = vfmadd132ps_fma(ZEXT1632(auVar40),auVar75,auVar75);
                auVar75 = vrcpps_avx(auVar64);
                auVar45 = vfnmadd213ps_fma(auVar56,auVar44,auVar52);
                auVar45 = vfmadd132ps_fma(ZEXT1632(auVar45),auVar44,auVar44);
                auVar68 = vfnmadd213ps_fma(auVar64,auVar75,auVar52);
                auVar68 = vfmadd132ps_fma(ZEXT1632(auVar68),auVar75,auVar75);
                auVar75 = vsubps_avx(ZEXT1632(auVar89),ZEXT1632(auVar95));
                auVar115 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                              CONCAT424(0x3f7ffffa,
                                                        CONCAT420(0x3f7ffffa,
                                                                  CONCAT416(0x3f7ffffa,
                                                                            CONCAT412(0x3f7ffffa,
                                                                                      CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
                auVar44 = vsubps_avx(auVar117,ZEXT1632(auVar95));
                auVar118 = ZEXT3264(CONCAT428(0x3f800003,
                                              CONCAT424(0x3f800003,
                                                        CONCAT420(0x3f800003,
                                                                  CONCAT416(0x3f800003,
                                                                            CONCAT412(0x3f800003,
                                                                                      CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
                auVar15._4_4_ = auVar40._4_4_ * auVar75._4_4_;
                auVar15._0_4_ = auVar40._0_4_ * auVar75._0_4_;
                auVar15._8_4_ = auVar40._8_4_ * auVar75._8_4_;
                auVar15._12_4_ = auVar40._12_4_ * auVar75._12_4_;
                auVar15._16_4_ = auVar75._16_4_ * 0.0;
                auVar15._20_4_ = auVar75._20_4_ * 0.0;
                auVar15._24_4_ = auVar75._24_4_ * 0.0;
                auVar15._28_4_ = auVar75._28_4_;
                auVar16._4_4_ = auVar40._4_4_ * auVar44._4_4_;
                auVar16._0_4_ = auVar40._0_4_ * auVar44._0_4_;
                auVar16._8_4_ = auVar40._8_4_ * auVar44._8_4_;
                auVar16._12_4_ = auVar40._12_4_ * auVar44._12_4_;
                auVar16._16_4_ = auVar44._16_4_ * 0.0;
                auVar16._20_4_ = auVar44._20_4_ * 0.0;
                auVar16._24_4_ = auVar44._24_4_ * 0.0;
                auVar16._28_4_ = auVar44._28_4_;
                auVar75 = vsubps_avx(ZEXT1632(auVar97),ZEXT1632(auVar92));
                auVar44 = vsubps_avx(auVar67,ZEXT1632(auVar92));
                auVar17._4_4_ = auVar45._4_4_ * auVar75._4_4_;
                auVar17._0_4_ = auVar45._0_4_ * auVar75._0_4_;
                auVar17._8_4_ = auVar45._8_4_ * auVar75._8_4_;
                auVar17._12_4_ = auVar45._12_4_ * auVar75._12_4_;
                auVar17._16_4_ = auVar75._16_4_ * 0.0;
                auVar17._20_4_ = auVar75._20_4_ * 0.0;
                auVar17._24_4_ = auVar75._24_4_ * 0.0;
                auVar17._28_4_ = auVar67._28_4_;
                auVar18._4_4_ = auVar45._4_4_ * auVar44._4_4_;
                auVar18._0_4_ = auVar45._0_4_ * auVar44._0_4_;
                auVar18._8_4_ = auVar45._8_4_ * auVar44._8_4_;
                auVar18._12_4_ = auVar45._12_4_ * auVar44._12_4_;
                auVar18._16_4_ = auVar44._16_4_ * 0.0;
                auVar18._20_4_ = auVar44._20_4_ * 0.0;
                auVar18._24_4_ = auVar44._24_4_ * 0.0;
                auVar18._28_4_ = auVar44._28_4_;
                auVar75 = vsubps_avx(ZEXT1632(auVar94),ZEXT1632(auVar99));
                auVar19._4_4_ = auVar68._4_4_ * auVar75._4_4_;
                auVar19._0_4_ = auVar68._0_4_ * auVar75._0_4_;
                auVar19._8_4_ = auVar68._8_4_ * auVar75._8_4_;
                auVar19._12_4_ = auVar68._12_4_ * auVar75._12_4_;
                auVar19._16_4_ = auVar75._16_4_ * 0.0;
                auVar19._20_4_ = auVar75._20_4_ * 0.0;
                auVar19._24_4_ = auVar75._24_4_ * 0.0;
                auVar19._28_4_ = auVar75._28_4_;
                auVar75 = vsubps_avx(auVar85,ZEXT1632(auVar99));
                auVar43._0_4_ = auVar68._0_4_ * auVar75._0_4_;
                auVar43._4_4_ = auVar68._4_4_ * auVar75._4_4_;
                auVar43._8_4_ = auVar68._8_4_ * auVar75._8_4_;
                auVar43._12_4_ = auVar68._12_4_ * auVar75._12_4_;
                auVar43._16_4_ = auVar75._16_4_ * 0.0;
                auVar43._20_4_ = auVar75._20_4_ * 0.0;
                auVar43._24_4_ = auVar75._24_4_ * 0.0;
                auVar43._28_4_ = 0;
                auVar75 = vpminsd_avx2(auVar15,auVar16);
                auVar44 = vpminsd_avx2(auVar17,auVar18);
                auVar75 = vpmaxsd_avx2(auVar75,auVar44);
                auVar44 = vpminsd_avx2(auVar19,auVar43);
                auVar75 = vpmaxsd_avx2(auVar75,auVar44);
                auVar86 = ZEXT3264(CONCAT428(0x7f800000,
                                             CONCAT424(0x7f800000,
                                                       CONCAT420(0x7f800000,
                                                                 CONCAT416(0x7f800000,
                                                                           CONCAT412(0x7f800000,
                                                                                     CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                auVar44 = vpmaxsd_avx2(auVar15,auVar16);
                auVar56 = vpmaxsd_avx2(auVar17,auVar18);
                auVar56 = vpminsd_avx2(auVar44,auVar56);
                auVar44 = vpmaxsd_avx2(auVar19,auVar43);
                auVar44 = vpminsd_avx2(auVar56,auVar44);
                auVar53._4_4_ = auVar75._4_4_ * 0.99999964;
                auVar53._0_4_ = auVar75._0_4_ * 0.99999964;
                auVar53._8_4_ = auVar75._8_4_ * 0.99999964;
                auVar53._12_4_ = auVar75._12_4_ * 0.99999964;
                auVar53._16_4_ = auVar75._16_4_ * 0.99999964;
                auVar53._20_4_ = auVar75._20_4_ * 0.99999964;
                auVar53._24_4_ = auVar75._24_4_ * 0.99999964;
                auVar53._28_4_ = auVar56._28_4_;
                auVar20._4_4_ = auVar44._4_4_ * 1.0000004;
                auVar20._0_4_ = auVar44._0_4_ * 1.0000004;
                auVar20._8_4_ = auVar44._8_4_ * 1.0000004;
                auVar20._12_4_ = auVar44._12_4_ * 1.0000004;
                auVar20._16_4_ = auVar44._16_4_ * 1.0000004;
                auVar20._20_4_ = auVar44._20_4_ * 1.0000004;
                auVar20._24_4_ = auVar44._24_4_ * 1.0000004;
                auVar20._28_4_ = auVar44._28_4_;
                auVar75 = vpmaxsd_avx2(auVar53,local_5aa0);
                auVar44 = vpminsd_avx2(auVar20,local_5a80);
                auVar44 = vcmpps_avx(auVar75,auVar44,2);
LAB_016b056b:
                auVar40 = auVar44._0_16_;
                auVar45 = auVar44._16_16_;
              }
              auVar40 = vpackssdw_avx(auVar40,auVar45);
              auVar45 = vpackssdw_avx(auVar54._0_16_,auVar54._16_16_);
              auVar40 = vpand_avx(auVar40,auVar45);
              auVar75 = vpmovzxwd_avx2(auVar40);
              auVar44 = vpslld_avx2(auVar75,0x1f);
              uVar38 = root.ptr;
              auVar75 = auVar50;
              if (((((((((auVar44 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar44 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar44 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar44 >> 0x7f,0) != '\0') ||
                     (auVar44 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar44 >> 0xbf,0) != '\0') ||
                   (auVar44 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar44[0x1f] < '\0') &&
                 (auVar75 = vblendvps_avx(auVar86._0_32_,auVar53,auVar44), uVar38 = uVar3,
                 root.ptr != 8)) {
                *puVar36 = root.ptr;
                puVar36 = puVar36 + 1;
                local_5ce0 = auVar50._0_8_;
                uStack_5cd8 = auVar50._8_8_;
                uStack_5cd0 = auVar50._16_8_;
                uStack_5cc8 = auVar50._24_8_;
                *(undefined8 *)*pauVar39 = local_5ce0;
                *(undefined8 *)(*pauVar39 + 8) = uStack_5cd8;
                *(undefined8 *)(*pauVar39 + 0x10) = uStack_5cd0;
                *(undefined8 *)(*pauVar39 + 0x18) = uStack_5cc8;
                pauVar39 = pauVar39 + 1;
              }
              auVar50 = auVar75;
              root.ptr = uVar38;
            }
            uVar34 = uVar35;
            if (root.ptr == 8) goto LAB_016b060f;
            auVar54 = vcmpps_avx(local_5a80,auVar50,6);
            uVar33 = vmovmskps_avx(auVar54);
          } while ((byte)uVar32 < (byte)POPCOUNT(uVar33));
          *puVar36 = root.ptr;
          puVar36 = puVar36 + 1;
          *pauVar39 = auVar50;
          pauVar39 = pauVar39 + 1;
LAB_016b060f:
          iVar30 = 4;
        }
        else {
          while (uVar34 != 0) {
            sVar2 = 0;
            for (uVar35 = uVar34; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
              sVar2 = sVar2 + 1;
            }
            uVar34 = uVar34 - 1 & uVar34;
            in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
            bVar29 = occluded1(This,bvh,root,sVar2,(Precalculations *)&local_59c0,ray,
                               (TravRayK<8,_true> *)&local_5c20.field_0,context);
            if (bVar29) {
              *(undefined4 *)(local_5c60 + sVar2 * 4) = 0xffffffff;
            }
          }
          auVar50 = _DAT_01f7b020 & ~local_5c60;
          iVar30 = 3;
          auVar86 = ZEXT3264(CONCAT428(0x7f800000,
                                       CONCAT424(0x7f800000,
                                                 CONCAT420(0x7f800000,
                                                           CONCAT416(0x7f800000,
                                                                     CONCAT412(0x7f800000,
                                                                               CONCAT48(0x7f800000,
                                                                                                                                                                                
                                                  0x7f8000007f800000)))))));
          auVar115 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                        CONCAT424(0x3f7ffffa,
                                                  CONCAT420(0x3f7ffffa,
                                                            CONCAT416(0x3f7ffffa,
                                                                      CONCAT412(0x3f7ffffa,
                                                                                CONCAT48(0x3f7ffffa,
                                                                                                                                                                                  
                                                  0x3f7ffffa3f7ffffa)))))));
          auVar118 = ZEXT3264(CONCAT428(0x3f800003,
                                        CONCAT424(0x3f800003,
                                                  CONCAT420(0x3f800003,
                                                            CONCAT416(0x3f800003,
                                                                      CONCAT412(0x3f800003,
                                                                                CONCAT48(0x3f800003,
                                                                                                                                                                                  
                                                  0x3f8000033f800003)))))));
          if ((((((((auVar50 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar50 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar50 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar50 >> 0x7f,0) != '\0') ||
                (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar50 >> 0xbf,0) != '\0') ||
              (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar50[0x1f] < '\0') {
            auVar55._8_4_ = 0xff800000;
            auVar55._0_8_ = 0xff800000ff800000;
            auVar55._12_4_ = 0xff800000;
            auVar55._16_4_ = 0xff800000;
            auVar55._20_4_ = 0xff800000;
            auVar55._24_4_ = 0xff800000;
            auVar55._28_4_ = 0xff800000;
            local_5a80 = vblendvps_avx(local_5a80,auVar55,local_5c60);
            iVar30 = 2;
          }
          auVar49 = ZEXT3264(auVar54);
          uVar34 = 0;
          if (uVar32 < (uint)POPCOUNT(uVar33)) goto LAB_016b00a6;
          uVar34 = 0;
        }
      } while (iVar30 != 3);
LAB_016b083c:
      auVar54 = vandps_avx(local_5a60,local_5c60);
      auVar48._8_4_ = 0xff800000;
      auVar48._0_8_ = 0xff800000ff800000;
      auVar48._12_4_ = 0xff800000;
      auVar48._16_4_ = 0xff800000;
      auVar48._20_4_ = 0xff800000;
      auVar48._24_4_ = 0xff800000;
      auVar48._28_4_ = 0xff800000;
      auVar54 = vmaskmovps_avx(auVar54,auVar48);
      *(undefined1 (*) [32])(ray + 0x100) = auVar54;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }